

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_relation.cpp
# Opt level: O2

string * __thiscall
duckdb::ViewRelation::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ViewRelation *this,idx_t depth)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  Relation::RenderWhitespace_abi_cxx11_(&local_38,(Relation *)depth,depth);
  ::std::operator+(&bStack_78,&local_38,"View [");
  ::std::operator+(&local_58,&bStack_78,&this->view_name);
  ::std::operator+(__return_storage_ptr__,&local_58,"]");
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string ViewRelation::ToString(idx_t depth) {
	return RenderWhitespace(depth) + "View [" + view_name + "]";
}